

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::NearestNeighborsIndex::MergePartialFromCodedStream
          (NearestNeighborsIndex *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  short extraout_AX;
  uint uVar6;
  uint32 uVar7;
  LinearIndex *this_00;
  ulong extraout_RAX;
  SquaredEuclideanDistance *this_01;
  ulong extraout_RAX_00;
  SingleKdTreeIndex *this_02;
  ulong extraout_RAX_01;
  Type *this_03;
  pair<int,_int> pVar8;
  int byte_limit;
  char cVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  int local_54;
  int local_50;
  int local_4c;
  
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar7 = (uint32)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar10 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        if ((input->buffer_end_ <= pbVar1) || ((~(uint)*pbVar1 & uVar10) < 0x80)) goto LAB_00205c95;
        uVar10 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = (ulong)uVar10 | 0x100000000;
    }
    else {
LAB_00205c95:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar11 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar7 | uVar11;
    }
    uVar10 = (uint)uVar11;
    if ((uVar11 & 0x100000000) == 0) {
LAB_00205a40:
      iVar12 = 7;
      if ((uVar10 & 7) != 4 && uVar10 != 0) {
        bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar10);
        if (bVar5) {
LAB_00205a6f:
          iVar12 = 0;
        }
        else {
          iVar12 = 6;
        }
      }
    }
    else {
      uVar6 = (uint)(uVar11 >> 3) & 0x1fffffff;
      cVar9 = (char)uVar11;
      if (uVar6 < 0x6e) {
        if (uVar6 == 2) {
          if (cVar9 == '\x12') {
            this_03 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                                (&(this->floatsamples_).super_RepeatedPtrFieldBase,(Type *)0x0);
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) &&
               (byte_limit = (int)(char)*puVar4, -1 < (char)*puVar4)) {
              input->buffer_ = puVar4 + 1;
              bVar5 = true;
            }
            else {
              byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback
                                     (input);
              bVar5 = -1 < byte_limit;
            }
            iVar12 = 6;
            if ((((bVar5) &&
                 (pVar8 = google::protobuf::io::CodedInputStream::
                          IncrementRecursionDepthAndPushLimit(input,byte_limit), -1 < (long)pVar8))
                && (bVar5 = FloatVector::MergePartialFromCodedStream(this_03,input), bVar5)) &&
               (bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                                  (input,pVar8.first), bVar5)) goto LAB_00205a6f;
            goto LAB_00205a72;
          }
        }
        else if (uVar6 == 100) {
          if (cVar9 == '\"') {
            if (this->_oneof_case_[0] != 100) {
              clear_IndexType(this);
              this->_oneof_case_[0] = 100;
              this_00 = (LinearIndex *)operator_new(0x18);
              LinearIndex::LinearIndex(this_00);
              (this->IndexType_).linearindex_ = this_00;
            }
            MergePartialFromCodedStream();
            iVar12 = local_4c;
            uVar11 = extraout_RAX;
            goto joined_r0x00205ba6;
          }
        }
        else if ((uVar6 == 1) && (MergePartialFromCodedStream(), extraout_AX != 0)) {
          iVar12 = 6;
          if (extraout_AX != 1) goto LAB_00205a6f;
          goto LAB_00205a72;
        }
        goto LAB_00205a40;
      }
      if (uVar6 == 0x6e) {
        if (cVar9 != 'r') goto LAB_00205a40;
        if (this->_oneof_case_[0] != 0x6e) {
          clear_IndexType(this);
          this->_oneof_case_[0] = 0x6e;
          this_02 = (SingleKdTreeIndex *)operator_new(0x18);
          SingleKdTreeIndex::SingleKdTreeIndex(this_02);
          (this->IndexType_).singlekdtreeindex_ = this_02;
        }
        MergePartialFromCodedStream();
        iVar12 = local_50;
        uVar11 = extraout_RAX_01;
joined_r0x00205ba6:
        if ((uVar11 & 1) != 0) goto LAB_00205a72;
        goto LAB_00205a6f;
      }
      if ((uVar6 != 200) || (cVar9 != 'B')) goto LAB_00205a40;
      if (this->_oneof_case_[1] != 200) {
        this->_oneof_case_[1] = 200;
        this_01 = (SquaredEuclideanDistance *)operator_new(0x18);
        SquaredEuclideanDistance::SquaredEuclideanDistance(this_01);
        (this->DistanceFunction_).squaredeuclideandistance_ = this_01;
      }
      MergePartialFromCodedStream();
      iVar12 = local_54;
      if ((extraout_RAX_00 & 1) == 0) goto LAB_00205a6f;
    }
LAB_00205a72:
    if (iVar12 != 0) {
      return iVar12 != 6;
    }
  } while( true );
}

Assistant:

bool NearestNeighborsIndex::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.NearestNeighborsIndex)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int32 numberOfDimensions = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &numberofdimensions_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.FloatVector floatSamples = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_floatsamples()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.LinearIndex linearIndex = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_linearindex()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SingleKdTreeIndex singleKdTreeIndex = 110;
      case 110: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(882u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_singlekdtreeindex()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SquaredEuclideanDistance squaredEuclideanDistance = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_squaredeuclideandistance()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.NearestNeighborsIndex)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.NearestNeighborsIndex)
  return false;
#undef DO_
}